

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

Aggregate * __thiscall
hta::Metric::aggregate_interval
          (Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end,
          Duration interval)

{
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var1;
  TimeAggregate *r;
  pointer pTVar2;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> rows;
  
  if ((long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r % interval.__r != 0) {
    __assert_fail("begin.time_since_epoch().count() % interval.count() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x8f,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)")
    ;
  }
  if ((long)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r % interval.__r == 0) {
    if ((long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <=
        (long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      __return_storage_ptr__->minimum = INFINITY;
      __return_storage_ptr__->maximum = -INFINITY;
      __return_storage_ptr__->sum = 0.0;
      __return_storage_ptr__->count = 0;
      __return_storage_ptr__->integral = 0.0;
      (__return_storage_ptr__->active_time).__r = 0;
      if ((long)begin.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r <
          (long)end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r) {
        _Var1._M_head_impl =
             (this->storage_metric_)._M_t.
             super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
             ._M_t.
             super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
             .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
        (*(_Var1._M_head_impl)->_vptr_Metric[6])
                  (&rows,_Var1._M_head_impl,
                   begin.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r,end.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            .__d.__r,interval.__r,1);
        for (pTVar2 = rows.
                      super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pTVar2 != rows.
                      super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                      _M_impl.super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
          Aggregate::operator+=(__return_storage_ptr__,pTVar2->aggregate);
        }
        std::_Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~_Vector_base
                  (&rows.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                  );
      }
      return __return_storage_ptr__;
    }
    __assert_fail("begin <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x91,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)")
    ;
  }
  __assert_fail("end.time_since_epoch().count() % interval.count() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                ,0x90,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)");
}

Assistant:

Aggregate Metric::aggregate_interval(TimePoint begin, TimePoint end, Duration interval)
{
    // We assume that timestamps provided are aligned and ordered
    // to ensure that everything pieces together exactly
    assert(begin.time_since_epoch().count() % interval.count() == 0);
    assert(end.time_since_epoch().count() % interval.count() == 0);
    assert(begin <= end);

    Aggregate aggregate;
    if (begin < end) // we can avoid creating empty vectors in this case
    {
        auto rows =
            storage_metric_->get(begin, end, interval, IntervalScope{ Scope::closed, Scope::open });
        for (const auto& r : rows)
        {
            aggregate += r.aggregate;
        }
    }
    return aggregate;
}